

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMeshSceneNode.cpp
# Opt level: O2

SMaterial * __thiscall irr::scene::CMeshSceneNode::getMaterial(CMeshSceneNode *this,u32 i)

{
  pointer pSVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  SMaterial *pSVar4;
  undefined1 *puVar5;
  
  if (((this->Mesh != (IMesh *)0x0) && (this->ReadOnlyMaterials == true)) &&
     (uVar2 = (**this->Mesh->_vptr_IMesh)(), i < uVar2)) {
    iVar3 = (*this->Mesh->_vptr_IMesh[1])(this->Mesh,(ulong)i);
    pSVar4 = (SMaterial *)
             (*(code *)**(undefined8 **)CONCAT44(extraout_var,iVar3))
                       ((undefined8 *)CONCAT44(extraout_var,iVar3));
    video::SMaterial::operator=(&this->ReadOnlyMaterial,pSVar4);
    return &this->ReadOnlyMaterial;
  }
  pSVar1 = (this->Materials).m_data.
           super__Vector_base<irr::video::SMaterial,_std::allocator<irr::video::SMaterial>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (i < (uint)(((long)(this->Materials).m_data.
                        super__Vector_base<irr::video::SMaterial,_std::allocator<irr::video::SMaterial>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) / 0xb8)) {
    puVar5 = (undefined1 *)(pSVar1 + i);
  }
  else {
    puVar5 = video::IdentityMaterial;
  }
  return (SMaterial *)puVar5;
}

Assistant:

video::SMaterial &CMeshSceneNode::getMaterial(u32 i)
{
	if (Mesh && ReadOnlyMaterials && i < Mesh->getMeshBufferCount()) {
		ReadOnlyMaterial = Mesh->getMeshBuffer(i)->getMaterial();
		return ReadOnlyMaterial;
	}

	if (i >= Materials.size())
		return ISceneNode::getMaterial(i);

	return Materials[i];
}